

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O1

void __thiscall wasm::LoopInvariantCodeMotion::visitLoop(LoopInvariantCodeMotion *this,Loop *loop)

{
  size_t *psVar1;
  Id *pIVar2;
  int iVar3;
  PassRunner *pPVar4;
  bool bVar5;
  pointer puVar6;
  bool bVar7;
  iterator __begin7;
  size_t __n;
  Expression *pEVar8;
  Block *this_00;
  Expression **ppEVar9;
  ulong extraout_RDX;
  ulong uVar10;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  __node_base_ptr p_Var11;
  LocalSet *pLVar12;
  LocalSet *pLVar13;
  Type *pTVar14;
  long lVar15;
  ulong uVar16;
  char cVar17;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  undefined1 local_510 [8];
  EffectAnalyzer effectsSoFar;
  EffectAnalyzer loopEffects;
  LoopSets loopSets;
  FindAll<wasm::LocalSet> finder;
  long local_1d8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1d0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_1a0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_170;
  char local_140;
  char local_13f;
  char local_13e;
  char local_13d;
  char local_13c;
  char local_13b;
  char local_13a;
  char local_139;
  char local_136;
  char local_135;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_118;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_e8;
  _Hash_node_base *local_b8;
  LocalSet *set_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numSetsForIndex;
  LocalSet *local_90;
  LocalSet *set;
  pointer local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> movedCode;
  _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Stack_58;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> work;
  Expression *curr;
  
  auStack_78 = (undefined1  [8])0x0;
  movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar4 = (this->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
           ).super_Pass.runner;
  effectsSoFar._0_8_ =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .
       super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .
       super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .currModule;
  local_510[0] = (pPVar4->options).ignoreImplicitTraps;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.localsRead;
  local_510[1] = (pPVar4->options).trapsNeverHappen;
  effectsSoFar.module._0_4_ = (((Module *)effectsSoFar._0_8_)->features).features;
  effectsSoFar.module._4_2_ = 0;
  effectsSoFar.localsRead._M_t._M_impl._0_4_ = 0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.localsWritten;
  effectsSoFar.localsWritten._M_t._M_impl._0_4_ = 0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.mutableGlobalsRead;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.globalsWritten;
  effectsSoFar.globalsWritten._M_t._M_impl._0_4_ = 0;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.breakTargets;
  effectsSoFar.breakTargets._M_t._M_impl._0_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.readsMemory = false;
  effectsSoFar.writesMemory = false;
  effectsSoFar.readsTable = false;
  effectsSoFar.writesTable = false;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  effectsSoFar.trap = false;
  effectsSoFar.implicitTrap = false;
  effectsSoFar.isAtomic = false;
  effectsSoFar.throws_ = false;
  effectsSoFar._228_4_ = 0;
  effectsSoFar.tryDepth._0_7_ = 0;
  effectsSoFar._239_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.delegateTargets;
  effectsSoFar.delegateTargets._M_t._M_impl._0_4_ = 0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &pPVar4->options,(Module *)effectsSoFar._0_8_,(Expression *)loop);
  __n = Function::getNumLocals
                  ((this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                   ).
                   super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .
                   super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .
                   super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .currFunction);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&set_1,__n,
             (allocator_type *)&loopSets._M_h._M_single_bucket);
  loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&loopSets._M_h._M_rehash_policy._M_next_resize;
  loopSets._M_h._M_buckets = (__buckets_ptr)0x1;
  loopSets._M_h._M_bucket_count = 0;
  loopSets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  loopSets._M_h._M_element_count._0_4_ = 0x3f800000;
  loopSets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  loopSets._M_h._M_rehash_policy._4_4_ = 0;
  loopSets._M_h._M_rehash_policy._M_next_resize = 0;
  numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)loop;
  FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)&loopSets._M_h._M_single_bucket,(Expression *)loop);
  if (loopSets._M_h._M_single_bucket !=
      (__node_base_ptr)
      finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    psVar1 = &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var11 = loopSets._M_h._M_single_bucket;
    do {
      local_90 = (LocalSet *)p_Var11->_M_nxt;
      pIVar2 = &(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id +
               (ulong)local_90->index * 4;
      *(int *)pIVar2 = *(int *)pIVar2 + 1;
      p_Stack_58 = (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)psVar1;
      std::
      _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<wasm::LocalSet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
                ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)psVar1,&stack0xffffffffffffff70,&p_Stack_58);
      p_Var11 = p_Var11 + 1;
    } while (p_Var11 !=
             (__node_base_ptr)
             finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (loopSets._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(loopSets._M_h._M_single_bucket,
                    CONCAT26(finder.list.
                             super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._6_2_,
                             CONCAT15(finder.list.
                                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._5_1_,
                                      CONCAT14(finder.list.
                                               super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_1_,
                                               finder.list.
                                               super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_))) -
                    (long)loopSets._M_h._M_single_bucket);
  }
  p_Stack_58 = (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)0x0;
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  loopSets._M_h._M_single_bucket =
       (__node_base_ptr)
       (numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage + 8);
  std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
  emplace_back<wasm::Expression**>
            ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)&p_Stack_58,
             (Expression ***)&loopSets._M_h._M_single_bucket);
  uVar10 = extraout_RDX;
LAB_0095384f:
  do {
    if (p_Stack_58 ==
        (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
           _M_impl.super__Vector_impl_data._M_start) {
LAB_00953ca3:
      if (auStack_78 !=
          (undefined1  [8])
          movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        loopSets._M_h._M_single_bucket =
             (__node_base_ptr)
             (this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
             ).
             super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             .
             super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             .
             super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             .currModule;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
        this_00 = Builder::
                  makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                            ((Builder *)&loopSets._M_h._M_single_bucket,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             auStack_78,type);
        puVar6 = numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(this_00->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)
                   numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             *(_Storage<wasm::Type,_true> *)(puVar6 + 2);
        Block::finalize(this_00,type_,Unknown);
        Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>::
        replaceCurrent((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                        *)&(this->
                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                           ).
                           super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                       ,(Expression *)this_00);
        ppEVar9 = SmallVector<wasm::Expression_*,_10UL>::back
                            (&(this->
                              super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                              ).
                              super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                              .expressionStack);
        *ppEVar9 = (Expression *)this_00;
      }
      if (p_Stack_58 !=
          (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
           *)0x0) {
        operator_delete(p_Stack_58,
                        (long)work.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)p_Stack_58);
      }
      std::
      _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
                   );
      if (set_1 != (LocalSet *)0x0) {
        operator_delete(set_1,(long)numSetsForIndex.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)set_1);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&loopEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&loopEffects.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&loopEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&loopEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&loopEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&loopEffects.features);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&effectsSoFar.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&effectsSoFar.features);
      if (auStack_78 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_78,
                        (long)movedCode.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
      }
      return;
    }
    ppEVar9 = work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
              _M_impl.super__Vector_impl_data._M_start[-1];
    work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
    super__Vector_impl_data._M_start =
         work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
         super__Vector_impl_data._M_start + -1;
    pEVar8 = *ppEVar9;
    work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pEVar8;
    if (pEVar8->_id != BlockId) {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)&loopSets._M_h._M_single_bucket,
                 &((this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                 ).
                 super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                 .
                 super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                 .
                 super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                 .currModule,pEVar8);
      if ((((finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_finish._4_1_ != '\0') || (local_135 != '\0')) ||
          (local_e8._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
         (local_118._M_impl.super__Rb_tree_header._M_node_count != 0)) {
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_e8);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_118);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_170);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_1a0);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_1d0);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&finder.list.
                        super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar10 = extraout_RDX_02;
        goto LAB_00953ca3;
      }
      bVar7 = interestingToMove(this,(Expression *)
                                     work.
                                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar7) {
        cVar17 = '\x01';
        if (((((local_170._M_impl.super__Rb_tree_header._M_node_count == 0) && (local_13f == '\0'))
             && ((local_13d == '\0' && ((local_13b == '\0' && (local_139 == '\0')))))) &&
            (local_136 == '\0')) &&
           ((finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_finish._5_1_ == '\0' &&
            (bVar7 = EffectAnalyzer::invalidates
                               ((EffectAnalyzer *)local_510,
                                (EffectAnalyzer *)&loopSets._M_h._M_single_bucket), !bVar7)))) {
          if (((local_1a0._M_impl.super__Rb_tree_header._M_node_count == 0) &&
              (((local_140 == '\0' && (local_13e == '\0')) && (local_13c == '\0')))) &&
             (((local_13a == '\0' && (local_136 == '\0')) &&
              (finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
               _M_impl.super__Vector_impl_data._M_finish._5_1_ != '\x01')))) {
            cVar17 = '\0';
          }
          else if (((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_right == (_Base_ptr)0x0) &&
                   (loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _1_1_ == '\0')) &&
                  ((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _3_1_ == '\0' &&
                   (((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                      _5_1_ == '\0' &&
                     (loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                      _7_1_ == '\0')) && (loopEffects.readsTable == false)))))) {
            cVar17 = loopEffects.module._5_1_;
          }
        }
        if (((local_135 != '\0') || (local_e8._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
           ((cVar17 != '\0' ||
             (loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
              (_Base_ptr)0x0 || loopEffects.writesTable != false) ||
            ((local_1d8 != 0 &&
             (bVar7 = hasGetDependingOnLoopSet
                                (this,(Expression *)
                                      work.
                                      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (LoopSets *)
                                 &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count), bVar7)))))) {
LAB_00953bf3:
          bVar5 = false;
        }
        else {
          FindAll<wasm::LocalSet>::FindAll
                    ((FindAll<wasm::LocalSet> *)&stack0xffffffffffffff70,
                     (Expression *)
                     work.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
          for (pLVar13 = local_90; pLVar13 != set;
              pLVar13 = (LocalSet *)
                        &(pLVar13->super_SpecificExpression<(wasm::Expression::Id)9>).
                         super_Expression.type) {
            uVar10 = (ulong)*(uint *)&(*(_Hash_node_base **)
                                        &(pLVar13->super_SpecificExpression<(wasm::Expression::Id)9>
                                         ).super_Expression)[2]._M_nxt;
            iVar3 = *(int *)(&(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).
                              super_Expression._id + uVar10 * 4);
            if (iVar3 == 0) {
              __assert_fail("numSetsForIndex[set->index] > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LoopInvariantCodeMotion.cpp"
                            ,0x92,"void wasm::LoopInvariantCodeMotion::visitLoop(Loop *)");
            }
            *(int *)(&(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                      _id + uVar10 * 4) = iVar3 + -1;
          }
          if (local_90 == set) {
            bVar7 = true;
          }
          else {
            bVar7 = true;
            pLVar13 = local_90;
            do {
              pTVar14 = &(pLVar13->super_SpecificExpression<(wasm::Expression::Id)9>).
                         super_Expression.type;
              if (*(int *)(&(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).
                            super_Expression._id +
                          (ulong)*(uint *)&(*(_Hash_node_base **)
                                             &(pLVar13->
                                              super_SpecificExpression<(wasm::Expression::Id)9>).
                                              super_Expression)[2]._M_nxt * 4) != 0) {
                bVar7 = false;
                break;
              }
              pLVar13 = (LocalSet *)pTVar14;
            } while ((LocalSet *)pTVar14 != set);
          }
          if (bVar7) {
            if (movedCode.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                movedCode.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              _M_realloc_insert<wasm::Expression*const&>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                         (iterator)
                         movedCode.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (Expression **)
                         &work.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            else {
              *movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_start =
                   (Expression *)
                   work.
                   super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   movedCode.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1;
            }
            pEVar8 = (Expression *)
                     MixedArena::allocSpace
                               (&((this->
                                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                                  ).
                                  super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                                  .
                                  super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                                  .
                                  super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                                 .currModule)->allocator,0x10,8);
            pLVar13 = set;
            pEVar8->_id = NopId;
            (pEVar8->type).id = 0;
            *ppEVar9 = pEVar8;
            bVar5 = true;
            for (pLVar12 = local_90; pLVar12 != pLVar13;
                pLVar12 = (LocalSet *)
                          &(pLVar12->super_SpecificExpression<(wasm::Expression::Id)9>).
                           super_Expression.type) {
              local_b8 = *(_Hash_node_base **)
                          &(pLVar12->super_SpecificExpression<(wasm::Expression::Id)9>).
                           super_Expression;
              std::
              _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::_M_erase((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                             _M_node_count,&local_b8);
            }
          }
          else {
            bVar5 = false;
            for (pLVar13 = local_90; pLVar13 != set;
                pLVar13 = (LocalSet *)
                          &(pLVar13->super_SpecificExpression<(wasm::Expression::Id)9>).
                           super_Expression.type) {
              pIVar2 = &(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                        _id + (ulong)*(uint *)&(*(_Hash_node_base **)
                                                 &(pLVar13->
                                                  super_SpecificExpression<(wasm::Expression::Id)9>)
                                                  .super_Expression)[2]._M_nxt * 4;
              *(int *)pIVar2 = *(int *)pIVar2 + 1;
            }
          }
          if (local_90 != (LocalSet *)0x0) {
            operator_delete(local_90,(long)local_80 - (long)local_90);
          }
          if (!bVar7) goto LAB_00953bf3;
        }
        if (!bVar5) goto LAB_00953bfb;
      }
      else {
LAB_00953bfb:
        EffectAnalyzer::mergeIn
                  ((EffectAnalyzer *)local_510,(EffectAnalyzer *)&loopSets._M_h._M_single_bucket);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_e8);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_118);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_170);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1d0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&finder.list.
                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar10 = extraout_RDX_01;
      goto LAB_0095384f;
    }
    uVar16 = (ulong)(uint)pEVar8[2].type.id;
    if (uVar16 != 0) {
      lVar15 = uVar16 * 8 + -8;
      do {
        uVar16 = uVar16 - 1;
        if (pEVar8[2].type.id <= uVar16) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        loopSets._M_h._M_single_bucket = (__node_base_ptr)(*(long *)(pEVar8 + 2) + lVar15);
        std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
        emplace_back<wasm::Expression**>
                  ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)&p_Stack_58,
                   (Expression ***)&loopSets._M_h._M_single_bucket);
        lVar15 = lVar15 + -8;
        uVar10 = extraout_RDX_00;
      } while (lVar15 != -8);
    }
  } while( true );
}

Assistant:

void visitLoop(Loop* loop) {
    // We accumulate all the code we can move out, and will place it
    // in a block just preceding the loop.
    std::vector<Expression*> movedCode;
    // Accumulate effects of things we can't move out - things
    // we move out later must cross them, so we must verify it
    // is ok to do so.
    EffectAnalyzer effectsSoFar(getPassOptions(), *getModule());
    // The loop's total effects also matter. For example, a store
    // in the loop means we can't move a load outside.
    // FIXME: we look at the loop "tail" area too, after the last
    //        possible branch back, which can cause false positives
    //        for bad effect interactions.
    EffectAnalyzer loopEffects(getPassOptions(), *getModule(), loop);
    // Note all the sets in each loop, and how many per index. Currently
    // EffectAnalyzer can't do that, and we need it to know if we
    // can move a set out of the loop (if there is another set
    // still there, we can't). Another possible option here is for
    // LocalGraph to track interfering sets. TODO
    // FIXME: also the loop tail issue from above.
    auto numLocals = getFunction()->getNumLocals();
    std::vector<Index> numSetsForIndex(numLocals);
    LoopSets loopSets;
    {
      FindAll<LocalSet> finder(loop);
      for (auto* set : finder.list) {
        numSetsForIndex[set->index]++;
        loopSets.insert(set);
      }
    }
    // Walk along the loop entrance, while all the code there
    // is executed unconditionally. That is the code we want to
    // move out - anything that might or might not be executed
    // may be best left alone anyhow.
    std::vector<Expression**> work;
    work.push_back(&loop->body);
    while (!work.empty()) {
      auto** currp = work.back();
      work.pop_back();
      auto* curr = *currp;
      // Look into blocks.
      if (auto* block = curr->dynCast<Block>()) {
        auto& list = block->list;
        Index i = list.size();
        while (i > 0) {
          i--;
          work.push_back(&list[i]);
        }
        continue;
        // Note that if the block had a merge at the end, we would have seen
        // a branch to it anyhow, so we would stop before that point anyhow.
      }
      // If this may branch, we are done.
      EffectAnalyzer effects(getPassOptions(), *getModule(), curr);
      if (effects.transfersControlFlow()) {
        break;
      }
      if (interestingToMove(curr)) {
        // Let's see if we can move this out.
        // Global state changes would prevent this - we might end up
        // executing them just once.
        // And we must also move across anything not moved out already,
        // so check for issues there too.
        // The rest of the loop's effects matter too, we must also
        // take into account global state like interacting loads and
        // stores.
        bool unsafeToMove = effects.writesGlobalState() ||
                            effectsSoFar.invalidates(effects) ||
                            (effects.readsMutableGlobalState() &&
                             loopEffects.writesGlobalState());
        // TODO: look into optimizing this with exceptions. for now, disallow
        if (effects.throws() || loopEffects.throws()) {
          unsafeToMove = true;
        }
        if (!unsafeToMove) {
          // So far so good. Check if our local dependencies are all
          // outside of the loop, in which case everything is good -
          // either they are before the loop and constant for us, or
          // they are after and don't matter.
          if (effects.localsRead.empty() ||
              !hasGetDependingOnLoopSet(curr, loopSets)) {
            // We have checked if our gets are influenced by sets in the loop,
            // and must also check if our sets interfere with them. To do so,
            // assume temporarily that we are moving curr out; see if any sets
            // remain for its indexes.
            FindAll<LocalSet> currSets(curr);
            for (auto* set : currSets.list) {
              assert(numSetsForIndex[set->index] > 0);
              numSetsForIndex[set->index]--;
            }
            bool canMove = true;
            for (auto* set : currSets.list) {
              if (numSetsForIndex[set->index] > 0) {
                canMove = false;
                break;
              }
            }
            if (!canMove) {
              // We failed to move the code, undo those changes.
              for (auto* set : currSets.list) {
                numSetsForIndex[set->index]++;
              }
            } else {
              // We can move it! Leave the changes, move the code, and update
              // loopSets.
              movedCode.push_back(curr);
              *currp = Builder(*getModule()).makeNop();
              for (auto* set : currSets.list) {
                loopSets.erase(set);
              }
              continue;
            }
          }
        }
      }
      // We did not move this item. Accumulate its effects.
      effectsSoFar.mergeIn(effects);
    }
    // If we moved the code out, finish up by emitting it
    // outside of the loop.
    // Note that this works with nested loops - after moving outside
    // of an inner loop, we can encounter it again in an outer loop,
    // and move it further outside, without requiring any extra pass.
    if (!movedCode.empty()) {
      // Finish the moving by emitting the code outside.
      Builder builder(*getModule());
      auto* ret = builder.makeBlock(movedCode);
      ret->list.push_back(loop);
      ret->finalize(loop->type);
      replaceCurrent(ret);
      // Note that we do not need to modify the localGraph - we keep
      // each get in a position to be influenced by exactly the same
      // sets as before.
    }
  }